

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

void __thiscall icu_63::CalendarAstronomer::clearCache(CalendarAstronomer *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  double dVar6;
  undefined4 uVar7;
  
  dVar6 = uprv_getNaN_63();
  uVar5 = SUB84(dVar6,0);
  uVar7 = (undefined4)((ulong)dVar6 >> 0x20);
  auVar1._8_4_ = uVar5;
  auVar1._0_8_ = dVar6;
  auVar1._12_4_ = uVar7;
  this->sunLongitude = dVar6;
  this->meanAnomalySun = (double)auVar1._8_8_;
  auVar2._8_4_ = uVar5;
  auVar2._0_8_ = dVar6;
  auVar2._12_4_ = uVar7;
  this->julianDay = dVar6;
  this->julianCentury = (double)auVar2._8_8_;
  auVar3._8_4_ = uVar5;
  auVar3._0_8_ = dVar6;
  auVar3._12_4_ = uVar7;
  this->meanAnomalyMoon = dVar6;
  this->eclipObliquity = (double)auVar3._8_8_;
  auVar4._8_4_ = uVar5;
  auVar4._0_8_ = dVar6;
  auVar4._12_4_ = uVar7;
  this->moonLongitude = dVar6;
  this->moonEclipLong = (double)auVar4._8_8_;
  this->siderealTime = dVar6;
  this->siderealT0 = dVar6;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

void CalendarAstronomer::clearCache() {
    const double INVALID = uprv_getNaN();

    julianDay       = INVALID;
    julianCentury   = INVALID;
    sunLongitude    = INVALID;
    meanAnomalySun  = INVALID;
    moonLongitude   = INVALID;
    moonEclipLong   = INVALID;
    meanAnomalyMoon = INVALID;
    eclipObliquity  = INVALID;
    siderealTime    = INVALID;
    siderealT0      = INVALID;
    moonPositionSet = FALSE;
}